

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::GenerateMergingCode
          (RepeatedPrimitive *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  anon_class_8_1_54a39810_for_cb aVar1;
  bool bVar2;
  Sub *local_168;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_135;
  allocator<char> local_121;
  string local_120;
  Sub *local_100;
  Sub local_f8;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  undefined1 local_20 [8];
  anon_class_8_1_54a39810_for_cb body;
  Printer *p_local;
  RepeatedPrimitive *this_local;
  
  local_20 = (undefined1  [8])&body;
  body.p = (Printer **)p;
  bVar2 = FieldGeneratorBase::should_split(&this->super_FieldGeneratorBase);
  aVar1.p = body.p;
  if (bVar2) {
    local_135 = 1;
    local_100 = &local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"body",&local_121);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateMergingCode(google::protobuf::io::Printer*)const::_lambda()_1_&>
              (&local_f8,&local_120,(anon_class_8_1_54a39810_for_cb *)local_20);
    local_135 = 0;
    local_40 = &local_f8;
    local_38 = 1;
    v._M_len = 1;
    v._M_array = local_40;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_30._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_148,
               "\n        if (!from.$field_$.IsDefault()) {\n          $body$;\n        }\n      ");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit
              ((Printer *)aVar1.p,local_30._M_allocated_capacity,local_30._8_8_,local_148._M_len,
               local_148._M_str);
    local_168 = (Sub *)&local_40;
    do {
      local_168 = local_168 + -1;
      protobuf::io::Printer::Sub::~Sub(local_168);
    } while (local_168 != &local_f8);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  else {
    protobuf::io::Printer::ValueImpl<true>::
    ToStringOrCallback<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/primitive_field.cc:312:17)_&,_void>
    ::anon_class_16_2_40fd6f3e::anon_class_8_1_54a39810_for_cb::operator()
              ((anon_class_8_1_54a39810_for_cb *)local_20);
  }
  return;
}

Assistant:

void GenerateMergingCode(io::Printer* p) const override {
    // TODO: experiment with simplifying this to be
    // `if (!from.empty()) { body(); }` for both split and non-split cases.
    auto body = [&] {
      p->Emit(R"cc(
        _this->_internal_mutable_$name$()->MergeFrom(from._internal_$name$());
      )cc");
    };
    if (!should_split()) {
      body();
    } else {
      p->Emit({{"body", body}}, R"cc(
        if (!from.$field_$.IsDefault()) {
          $body$;
        }
      )cc");
    }
  }